

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.h
# Opt level: O0

void __thiscall crnlib::dxt5_block::set_selector(dxt5_block *this,uint x,uint y,uint val)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint v;
  uint bit_ofs;
  uint byte_index;
  uint bit_index;
  uint selector_index;
  uint val_local;
  uint y_local;
  uint x_local;
  dxt5_block *this_local;
  
  uVar2 = (y * 4 + x) * 3;
  uVar3 = uVar2 >> 3;
  bVar1 = (byte)uVar2 & 7;
  v = (uint)this->m_selectors[uVar3];
  if (uVar3 < 5) {
    v = (uint)CONCAT11(this->m_selectors[uVar3 + 1],this->m_selectors[uVar3]);
  }
  uVar2 = val << bVar1 | (7 << bVar1 ^ 0xffffffffU) & v;
  this->m_selectors[uVar3] = (uint8)uVar2;
  if (uVar3 < 5) {
    this->m_selectors[uVar3 + 1] = (uint8)(uVar2 >> 8);
  }
  return;
}

Assistant:

inline void set_selector(uint x, uint y, uint val) {
    CRNLIB_ASSERT((x < 4U) && (y < 4U) && (val < 8U));

    uint selector_index = (y * 4) + x;
    uint bit_index = selector_index * cDXT5SelectorBits;

    uint byte_index = bit_index >> 3;
    uint bit_ofs = bit_index & 7;

    uint v = m_selectors[byte_index];
    if (byte_index < (cNumSelectorBytes - 1))
      v |= (m_selectors[byte_index + 1] << 8);

    v &= (~(7 << bit_ofs));
    v |= (val << bit_ofs);

    m_selectors[byte_index] = static_cast<uint8>(v);
    if (byte_index < (cNumSelectorBytes - 1))
      m_selectors[byte_index + 1] = static_cast<uint8>(v >> 8);
  }